

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::formatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format)

{
  ostringstream *poVar1;
  char *pcVar2;
  VkFormatFeatureFlags VVar3;
  bool bVar4;
  bool bVar5;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  MessageBuilder *pMVar6;
  TestStatus *pTVar7;
  long lVar8;
  uint uVar9;
  VkFormatFeatureFlags VVar10;
  uint uVar11;
  Bitfield<32UL> local_258;
  VkFormat local_23c;
  TestStatus *local_238;
  TestLog *local_230;
  undefined1 local_228 [16];
  anon_struct_24_3_8eb95548 fields [3];
  Bitfield<32UL> local_1c8;
  MessageBuilder local_1b0;
  
  local_230 = context->m_testCtx->m_log;
  local_238 = __return_storage_ptr__;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  local_23c = format;
  local_228._0_12_ =
       (undefined1  [12])::vk::getPhysicalDeviceFormatProperties(vk,physicalDevice,format);
  fields[0].field = 0;
  fields[0].fieldName = "linearTilingFeatures";
  fields[0].requiredFeatures = 0;
  fields[1].field = 4;
  fields[1].fieldName = "optimalTilingFeatures";
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
       s_requiredSampledImageBlitSrcFormats;
  local_258.m_value = (deUint64)&DAT_0096cacc;
  local_1c8.m_value._0_4_ = format;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  uVar9 = 0x401;
  if (!bVar4) {
    uVar9 = 0;
  }
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
       s_requiredSampledImageFilterLinearFormats;
  local_258.m_value = (deUint64)&DAT_0096cb24;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  uVar11 = uVar9 + 0x1000;
  if (!bVar4) {
    uVar11 = uVar9;
  }
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
       s_requiredStorageImageFormats;
  local_258.m_value =
       (deUint64)
       &api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
        s_requiredStorageImageAtomicFormats;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  uVar9 = uVar11 + 2;
  if (!bVar4) {
    uVar9 = uVar11;
  }
  local_1b0.m_log =
       (TestLog *)
       &api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
        s_requiredStorageImageAtomicFormats;
  local_258.m_value = (deUint64)&DAT_0096cb78;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  uVar11 = uVar9 + 4;
  if (!bVar4) {
    uVar11 = uVar9;
  }
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
       s_requiredColorAttachmentBlitDstFormats;
  local_258.m_value = (deUint64)&DAT_0096cc18;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  uVar9 = uVar11 | 0x880;
  if (!bVar4) {
    uVar9 = uVar11;
  }
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
       s_requiredColorAttachmentBlendFormats;
  local_258.m_value =
       (deUint64)
       &api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
        s_requiredDepthStencilAttachmentFormats;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  uVar11 = uVar9 | 0x100;
  if (!bVar4) {
    uVar11 = uVar9;
  }
  local_1b0.m_log =
       (TestLog *)
       &api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
        s_requiredDepthStencilAttachmentFormats;
  local_258.m_value = (deUint64)&DAT_0096cc5c;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  fields[1].requiredFeatures = uVar11 | 0x200;
  if (!bVar4) {
    fields[1].requiredFeatures = uVar11;
  }
  fields[2].field = 8;
  fields[2].fieldName = "buffeFeatures";
  local_1c8.m_value._0_4_ = local_23c;
  local_1b0.m_log =
       (TestLog *)
       &api::(anonymous_namespace)::getRequiredBufferFeatures(vk::VkFormat)::
        s_requiredVertexBufferFormats;
  local_258.m_value = 0x96cd14;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredBufferFeatures(vk::VkFormat)::
       s_requiredUniformTexelBufferFormats;
  local_258.m_value = (deUint64)&DAT_0096cdb8;
  bVar5 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  VVar10 = (uint)bVar4 * 0x40 + 8;
  if (!bVar5) {
    VVar10 = (uint)bVar4 * 0x40;
  }
  local_1b0.m_log =
       (TestLog *)
       api::(anonymous_namespace)::getRequiredBufferFeatures(vk::VkFormat)::
       s_requiredStorageTexelBufferFormats;
  local_258.m_value =
       (deUint64)
       &api::(anonymous_namespace)::getRequiredBufferFeatures(vk::VkFormat)::
        s_requiredStorageTexelBufferAtomicFormats;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  VVar3 = VVar10 + 0x10;
  if (!bVar4) {
    VVar3 = VVar10;
  }
  local_1b0.m_log =
       (TestLog *)
       &api::(anonymous_namespace)::getRequiredBufferFeatures(vk::VkFormat)::
        s_requiredStorageTexelBufferAtomicFormats;
  local_258.m_value = (deUint64)&DAT_0096ce18;
  bVar4 = de::contains<vk::VkFormat_const*,vk::VkFormat>
                    ((VkFormat **)&local_1b0,(VkFormat **)&local_258,(VkFormat *)&local_1c8);
  fields[2].requiredFeatures = VVar3 + 0x20;
  if (!bVar4) {
    fields[2].requiredFeatures = VVar3;
  }
  local_1b0.m_log = local_230;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  ::vk::operator<<((ostream *)poVar1,(VkFormatProperties *)local_228);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  bVar4 = true;
  poVar1 = &local_1b0.m_str;
  for (lVar8 = 0x10; lVar8 != 0x58; lVar8 = lVar8 + 0x18) {
    uVar9 = *(uint *)(local_228 + *(long *)(local_228 + lVar8));
    uVar11 = *(uint *)((long)&fields[0].field + lVar8);
    if ((uVar11 & ~uVar9) != 0) {
      pcVar2 = *(char **)(local_228 + lVar8 + 8);
      local_1b0.m_log = local_230;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"ERROR in ");
      std::operator<<((ostream *)poVar1,pcVar2);
      std::operator<<((ostream *)poVar1,":\n");
      std::operator<<((ostream *)poVar1,"  required: ");
      ::vk::getFormatFeatureFlagsStr(&local_258,uVar11);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_1b0,&local_258);
      std::operator<<((ostream *)&pMVar6->m_str,"\n  ");
      std::operator<<((ostream *)&pMVar6->m_str,"  missing: ");
      ::vk::getFormatFeatureFlagsStr(&local_1c8,uVar11 & ~uVar9);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1c8);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      bVar4 = false;
    }
  }
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Query and validation passed",(allocator<char> *)&local_258);
    pTVar7 = local_238;
    tcu::TestStatus::pass(local_238,(string *)&local_1b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Required features not supported",(allocator<char> *)&local_258)
    ;
    pTVar7 = local_238;
    tcu::TestStatus::fail(local_238,(string *)&local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  return pTVar7;
}

Assistant:

tcu::TestStatus formatProperties (Context& context, VkFormat format)
{
	TestLog&					log				= context.getTestContext().getLog();
	const VkFormatProperties	properties		= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	bool						allOk			= true;

	const struct
	{
		VkFormatFeatureFlags VkFormatProperties::*	field;
		const char*									fieldName;
		VkFormatFeatureFlags						requiredFeatures;
	} fields[] =
	{
		{ &VkFormatProperties::linearTilingFeatures,	"linearTilingFeatures",		(VkFormatFeatureFlags)0						},
		{ &VkFormatProperties::optimalTilingFeatures,	"optimalTilingFeatures",	getRequiredOptimalTilingFeatures(format)	},
		{ &VkFormatProperties::bufferFeatures,			"buffeFeatures",			getRequiredBufferFeatures(format)			}
	};

	log << TestLog::Message << properties << TestLog::EndMessage;

	for (int fieldNdx = 0; fieldNdx < DE_LENGTH_OF_ARRAY(fields); fieldNdx++)
	{
		const char* const				fieldName	= fields[fieldNdx].fieldName;
		const VkFormatFeatureFlags		supported	= properties.*fields[fieldNdx].field;
		const VkFormatFeatureFlags		required	= fields[fieldNdx].requiredFeatures;

		if ((supported & required) != required)
		{
			log << TestLog::Message << "ERROR in " << fieldName << ":\n"
								    << "  required: " << getFormatFeatureFlagsStr(required) << "\n  "
									<< "  missing: " << getFormatFeatureFlagsStr(~supported & required)
				<< TestLog::EndMessage;
			allOk = false;
		}
	}

	if (allOk)
		return tcu::TestStatus::pass("Query and validation passed");
	else
		return tcu::TestStatus::fail("Required features not supported");
}